

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O0

bool __thiscall
cmCMakeHostSystemInformationCommand::GetValue
          (cmCMakeHostSystemInformationCommand *this,SystemInformation *info,string *key,
          string *value)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  undefined1 local_3e0 [8];
  string e;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string *local_30;
  string *value_local;
  string *key_local;
  SystemInformation *info_local;
  cmCMakeHostSystemInformationCommand *this_local;
  
  local_30 = value;
  value_local = key;
  key_local = (string *)info;
  info_local = (SystemInformation *)this;
  bVar1 = std::operator==(key,"NUMBER_OF_LOGICAL_CORES");
  if (bVar1) {
    uVar2 = cmsys::SystemInformation::GetNumberOfLogicalCPU((SystemInformation *)key_local);
    ValueToString_abi_cxx11_(&local_50,this,(ulong)uVar2);
    std::__cxx11::string::operator=((string *)local_30,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    bVar1 = std::operator==(value_local,"NUMBER_OF_PHYSICAL_CORES");
    if (bVar1) {
      uVar2 = cmsys::SystemInformation::GetNumberOfPhysicalCPU((SystemInformation *)key_local);
      ValueToString_abi_cxx11_(&local_70,this,(ulong)uVar2);
      std::__cxx11::string::operator=((string *)local_30,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      bVar1 = std::operator==(value_local,"HOSTNAME");
      if (bVar1) {
        pcVar4 = cmsys::SystemInformation::GetHostname((SystemInformation *)key_local);
        ValueToString_abi_cxx11_(&local_90,this,pcVar4);
        std::__cxx11::string::operator=((string *)local_30,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        bVar1 = std::operator==(value_local,"FQDN");
        if (bVar1) {
          cmsys::SystemInformation::GetFullyQualifiedDomainName_abi_cxx11_
                    (&local_d0,(SystemInformation *)key_local);
          ValueToString(&local_b0,this,&local_d0);
          std::__cxx11::string::operator=((string *)local_30,(string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d0);
        }
        else {
          bVar1 = std::operator==(value_local,"TOTAL_VIRTUAL_MEMORY");
          if (bVar1) {
            sVar3 = cmsys::SystemInformation::GetTotalVirtualMemory((SystemInformation *)key_local);
            ValueToString_abi_cxx11_(&local_100,this,sVar3);
            std::__cxx11::string::operator=((string *)local_30,(string *)&local_100);
            std::__cxx11::string::~string((string *)&local_100);
          }
          else {
            bVar1 = std::operator==(value_local,"AVAILABLE_VIRTUAL_MEMORY");
            if (bVar1) {
              sVar3 = cmsys::SystemInformation::GetAvailableVirtualMemory
                                ((SystemInformation *)key_local);
              ValueToString_abi_cxx11_(&local_120,this,sVar3);
              std::__cxx11::string::operator=((string *)local_30,(string *)&local_120);
              std::__cxx11::string::~string((string *)&local_120);
            }
            else {
              bVar1 = std::operator==(value_local,"TOTAL_PHYSICAL_MEMORY");
              if (bVar1) {
                sVar3 = cmsys::SystemInformation::GetTotalPhysicalMemory
                                  ((SystemInformation *)key_local);
                ValueToString_abi_cxx11_(&local_140,this,sVar3);
                std::__cxx11::string::operator=((string *)local_30,(string *)&local_140);
                std::__cxx11::string::~string((string *)&local_140);
              }
              else {
                bVar1 = std::operator==(value_local,"AVAILABLE_PHYSICAL_MEMORY");
                if (bVar1) {
                  sVar3 = cmsys::SystemInformation::GetAvailablePhysicalMemory
                                    ((SystemInformation *)key_local);
                  ValueToString_abi_cxx11_(&local_160,this,sVar3);
                  std::__cxx11::string::operator=((string *)local_30,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                else {
                  bVar1 = std::operator==(value_local,"IS_64BIT");
                  if (bVar1) {
                    bVar1 = cmsys::SystemInformation::Is64Bits((SystemInformation *)key_local);
                    ValueToString_abi_cxx11_(&local_180,this,(ulong)bVar1);
                    std::__cxx11::string::operator=((string *)local_30,(string *)&local_180);
                    std::__cxx11::string::~string((string *)&local_180);
                  }
                  else {
                    bVar1 = std::operator==(value_local,"HAS_FPU");
                    if (bVar1) {
                      bVar1 = cmsys::SystemInformation::DoesCPUSupportFeature
                                        ((SystemInformation *)key_local,0x800000);
                      ValueToString_abi_cxx11_(&local_1a0,this,(ulong)bVar1);
                      std::__cxx11::string::operator=((string *)local_30,(string *)&local_1a0);
                      std::__cxx11::string::~string((string *)&local_1a0);
                    }
                    else {
                      bVar1 = std::operator==(value_local,"HAS_MMX");
                      if (bVar1) {
                        bVar1 = cmsys::SystemInformation::DoesCPUSupportFeature
                                          ((SystemInformation *)key_local,1);
                        ValueToString_abi_cxx11_(&local_1c0,this,(ulong)bVar1);
                        std::__cxx11::string::operator=((string *)local_30,(string *)&local_1c0);
                        std::__cxx11::string::~string((string *)&local_1c0);
                      }
                      else {
                        bVar1 = std::operator==(value_local,"HAS_MMX_PLUS");
                        if (bVar1) {
                          bVar1 = cmsys::SystemInformation::DoesCPUSupportFeature
                                            ((SystemInformation *)key_local,2);
                          ValueToString_abi_cxx11_(&local_1e0,this,(ulong)bVar1);
                          std::__cxx11::string::operator=((string *)local_30,(string *)&local_1e0);
                          std::__cxx11::string::~string((string *)&local_1e0);
                        }
                        else {
                          bVar1 = std::operator==(value_local,"HAS_SSE");
                          if (bVar1) {
                            bVar1 = cmsys::SystemInformation::DoesCPUSupportFeature
                                              ((SystemInformation *)key_local,4);
                            ValueToString_abi_cxx11_(&local_200,this,(ulong)bVar1);
                            std::__cxx11::string::operator=((string *)local_30,(string *)&local_200)
                            ;
                            std::__cxx11::string::~string((string *)&local_200);
                          }
                          else {
                            bVar1 = std::operator==(value_local,"HAS_SSE2");
                            if (bVar1) {
                              bVar1 = cmsys::SystemInformation::DoesCPUSupportFeature
                                                ((SystemInformation *)key_local,8);
                              ValueToString_abi_cxx11_(&local_220,this,(ulong)bVar1);
                              std::__cxx11::string::operator=
                                        ((string *)local_30,(string *)&local_220);
                              std::__cxx11::string::~string((string *)&local_220);
                            }
                            else {
                              bVar1 = std::operator==(value_local,"HAS_SSE_FP");
                              if (bVar1) {
                                bVar1 = cmsys::SystemInformation::DoesCPUSupportFeature
                                                  ((SystemInformation *)key_local,0x800);
                                ValueToString_abi_cxx11_(&local_240,this,(ulong)bVar1);
                                std::__cxx11::string::operator=
                                          ((string *)local_30,(string *)&local_240);
                                std::__cxx11::string::~string((string *)&local_240);
                              }
                              else {
                                bVar1 = std::operator==(value_local,"HAS_SSE_MMX");
                                if (bVar1) {
                                  bVar1 = cmsys::SystemInformation::DoesCPUSupportFeature
                                                    ((SystemInformation *)key_local,0x1000);
                                  ValueToString_abi_cxx11_(&local_260,this,(ulong)bVar1);
                                  std::__cxx11::string::operator=
                                            ((string *)local_30,(string *)&local_260);
                                  std::__cxx11::string::~string((string *)&local_260);
                                }
                                else {
                                  bVar1 = std::operator==(value_local,"HAS_AMD_3DNOW");
                                  if (bVar1) {
                                    bVar1 = cmsys::SystemInformation::DoesCPUSupportFeature
                                                      ((SystemInformation *)key_local,0x10);
                                    ValueToString_abi_cxx11_(&local_280,this,(ulong)bVar1);
                                    std::__cxx11::string::operator=
                                              ((string *)local_30,(string *)&local_280);
                                    std::__cxx11::string::~string((string *)&local_280);
                                  }
                                  else {
                                    bVar1 = std::operator==(value_local,"HAS_AMD_3DNOW_PLUS");
                                    if (bVar1) {
                                      bVar1 = cmsys::SystemInformation::DoesCPUSupportFeature
                                                        ((SystemInformation *)key_local,0x20);
                                      ValueToString_abi_cxx11_(&local_2a0,this,(ulong)bVar1);
                                      std::__cxx11::string::operator=
                                                ((string *)local_30,(string *)&local_2a0);
                                      std::__cxx11::string::~string((string *)&local_2a0);
                                    }
                                    else {
                                      bVar1 = std::operator==(value_local,"HAS_IA64");
                                      if (bVar1) {
                                        bVar1 = cmsys::SystemInformation::DoesCPUSupportFeature
                                                          ((SystemInformation *)key_local,0x40);
                                        ValueToString_abi_cxx11_(&local_2c0,this,(ulong)bVar1);
                                        std::__cxx11::string::operator=
                                                  ((string *)local_30,(string *)&local_2c0);
                                        std::__cxx11::string::~string((string *)&local_2c0);
                                      }
                                      else {
                                        bVar1 = std::operator==(value_local,"HAS_SERIAL_NUMBER");
                                        if (bVar1) {
                                          bVar1 = cmsys::SystemInformation::DoesCPUSupportFeature
                                                            ((SystemInformation *)key_local,0x200);
                                          ValueToString_abi_cxx11_(&local_2e0,this,(ulong)bVar1);
                                          std::__cxx11::string::operator=
                                                    ((string *)local_30,(string *)&local_2e0);
                                          std::__cxx11::string::~string((string *)&local_2e0);
                                        }
                                        else {
                                          bVar1 = std::operator==(value_local,"PROCESSOR_NAME");
                                          if (bVar1) {
                                            pcVar4 = cmsys::SystemInformation::
                                                     GetExtendedProcessorName
                                                               ((SystemInformation *)key_local);
                                            ValueToString_abi_cxx11_(&local_300,this,pcVar4);
                                            std::__cxx11::string::operator=
                                                      ((string *)local_30,(string *)&local_300);
                                            std::__cxx11::string::~string((string *)&local_300);
                                          }
                                          else {
                                            bVar1 = std::operator==(value_local,
                                                                    "PROCESSOR_DESCRIPTION");
                                            if (bVar1) {
                                              cmsys::SystemInformation::GetCPUDescription_abi_cxx11_
                                                        (&local_320,(SystemInformation *)key_local);
                                              std::__cxx11::string::operator=
                                                        ((string *)local_30,(string *)&local_320);
                                              std::__cxx11::string::~string((string *)&local_320);
                                            }
                                            else {
                                              bVar1 = std::operator==(value_local,
                                                                      "PROCESSOR_SERIAL_NUMBER");
                                              if (bVar1) {
                                                pcVar4 = cmsys::SystemInformation::
                                                         GetProcessorSerialNumber
                                                                   ((SystemInformation *)key_local);
                                                ValueToString_abi_cxx11_(&local_340,this,pcVar4);
                                                std::__cxx11::string::operator=
                                                          ((string *)local_30,(string *)&local_340);
                                                std::__cxx11::string::~string((string *)&local_340);
                                              }
                                              else {
                                                bVar1 = std::operator==(value_local,"OS_NAME");
                                                if (bVar1) {
                                                  pcVar4 = cmsys::SystemInformation::GetOSName
                                                                     ((SystemInformation *)key_local
                                                                     );
                                                  ValueToString_abi_cxx11_(&local_360,this,pcVar4);
                                                  std::__cxx11::string::operator=
                                                            ((string *)local_30,(string *)&local_360
                                                            );
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_360);
                                                }
                                                else {
                                                  bVar1 = std::operator==(value_local,"OS_RELEASE");
                                                  if (bVar1) {
                                                    pcVar4 = cmsys::SystemInformation::GetOSRelease
                                                                       ((SystemInformation *)
                                                                        key_local);
                                                    ValueToString_abi_cxx11_(&local_380,this,pcVar4)
                                                    ;
                                                    std::__cxx11::string::operator=
                                                              ((string *)local_30,
                                                               (string *)&local_380);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_380);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(value_local,"OS_VERSION"
                                                                           );
                                                    if (bVar1) {
                                                      pcVar4 = cmsys::SystemInformation::
                                                               GetOSVersion((SystemInformation *)
                                                                            key_local);
                                                      ValueToString_abi_cxx11_
                                                                (&local_3a0,this,pcVar4);
                                                      std::__cxx11::string::operator=
                                                                ((string *)local_30,
                                                                 (string *)&local_3a0);
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_3a0);
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(value_local,
                                                                              "OS_PLATFORM");
                                                      if (!bVar1) {
                                                        std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_3e0,"does not recognize <key> ",
                                                  value_local);
                                                  cmCommand::SetError(&this->super_cmCommand,
                                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_3e0);
                                                  this_local._7_1_ = 0;
                                                  std::__cxx11::string::~string((string *)local_3e0)
                                                  ;
                                                  goto LAB_003b5860;
                                                  }
                                                  pcVar4 = cmsys::SystemInformation::GetOSPlatform
                                                                     ((SystemInformation *)key_local
                                                                     );
                                                  ValueToString_abi_cxx11_
                                                            ((string *)((long)&e.field_2 + 8),this,
                                                             pcVar4);
                                                  std::__cxx11::string::operator=
                                                            ((string *)local_30,
                                                             (string *)(e.field_2._M_local_buf + 8))
                                                  ;
                                                  std::__cxx11::string::~string
                                                            ((string *)(e.field_2._M_local_buf + 8))
                                                  ;
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  this_local._7_1_ = 1;
LAB_003b5860:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCMakeHostSystemInformationCommand::GetValue(
  cmsys::SystemInformation& info, std::string const& key, std::string& value)
{
  if (key == "NUMBER_OF_LOGICAL_CORES") {
    value = this->ValueToString(info.GetNumberOfLogicalCPU());
  } else if (key == "NUMBER_OF_PHYSICAL_CORES") {
    value = this->ValueToString(info.GetNumberOfPhysicalCPU());
  } else if (key == "HOSTNAME") {
    value = this->ValueToString(info.GetHostname());
  } else if (key == "FQDN") {
    value = this->ValueToString(info.GetFullyQualifiedDomainName());
  } else if (key == "TOTAL_VIRTUAL_MEMORY") {
    value = this->ValueToString(info.GetTotalVirtualMemory());
  } else if (key == "AVAILABLE_VIRTUAL_MEMORY") {
    value = this->ValueToString(info.GetAvailableVirtualMemory());
  } else if (key == "TOTAL_PHYSICAL_MEMORY") {
    value = this->ValueToString(info.GetTotalPhysicalMemory());
  } else if (key == "AVAILABLE_PHYSICAL_MEMORY") {
    value = this->ValueToString(info.GetAvailablePhysicalMemory());
  } else if (key == "IS_64BIT") {
    value = this->ValueToString(info.Is64Bits());
  } else if (key == "HAS_FPU") {
    value = this->ValueToString(
      info.DoesCPUSupportFeature(cmsys::SystemInformation::CPU_FEATURE_FPU));
  } else if (key == "HAS_MMX") {
    value = this->ValueToString(
      info.DoesCPUSupportFeature(cmsys::SystemInformation::CPU_FEATURE_MMX));
  } else if (key == "HAS_MMX_PLUS") {
    value = this->ValueToString(info.DoesCPUSupportFeature(
      cmsys::SystemInformation::CPU_FEATURE_MMX_PLUS));
  } else if (key == "HAS_SSE") {
    value = this->ValueToString(
      info.DoesCPUSupportFeature(cmsys::SystemInformation::CPU_FEATURE_SSE));
  } else if (key == "HAS_SSE2") {
    value = this->ValueToString(
      info.DoesCPUSupportFeature(cmsys::SystemInformation::CPU_FEATURE_SSE2));
  } else if (key == "HAS_SSE_FP") {
    value = this->ValueToString(info.DoesCPUSupportFeature(
      cmsys::SystemInformation::CPU_FEATURE_SSE_FP));
  } else if (key == "HAS_SSE_MMX") {
    value = this->ValueToString(info.DoesCPUSupportFeature(
      cmsys::SystemInformation::CPU_FEATURE_SSE_MMX));
  } else if (key == "HAS_AMD_3DNOW") {
    value = this->ValueToString(info.DoesCPUSupportFeature(
      cmsys::SystemInformation::CPU_FEATURE_AMD_3DNOW));
  } else if (key == "HAS_AMD_3DNOW_PLUS") {
    value = this->ValueToString(info.DoesCPUSupportFeature(
      cmsys::SystemInformation::CPU_FEATURE_AMD_3DNOW_PLUS));
  } else if (key == "HAS_IA64") {
    value = this->ValueToString(
      info.DoesCPUSupportFeature(cmsys::SystemInformation::CPU_FEATURE_IA64));
  } else if (key == "HAS_SERIAL_NUMBER") {
    value = this->ValueToString(info.DoesCPUSupportFeature(
      cmsys::SystemInformation::CPU_FEATURE_SERIALNUMBER));
  } else if (key == "PROCESSOR_NAME") {
    value = this->ValueToString(info.GetExtendedProcessorName());
  } else if (key == "PROCESSOR_DESCRIPTION") {
    value = info.GetCPUDescription();
  } else if (key == "PROCESSOR_SERIAL_NUMBER") {
    value = this->ValueToString(info.GetProcessorSerialNumber());
  } else if (key == "OS_NAME") {
    value = this->ValueToString(info.GetOSName());
  } else if (key == "OS_RELEASE") {
    value = this->ValueToString(info.GetOSRelease());
  } else if (key == "OS_VERSION") {
    value = this->ValueToString(info.GetOSVersion());
  } else if (key == "OS_PLATFORM") {
    value = this->ValueToString(info.GetOSPlatform());
#ifdef HAVE_VS_SETUP_HELPER
  } else if (key == "VS_15_DIR") {
    // If generating for the VS 15 IDE, use the same instance.
    cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
    if (cmHasLiteralPrefix(gg->GetName(), "Visual Studio 15 ")) {
      cmGlobalVisualStudioVersionedGenerator* vs15gen =
        static_cast<cmGlobalVisualStudioVersionedGenerator*>(gg);
      if (vs15gen->GetVSInstance(value)) {
        return true;
      }
    }

    // Otherwise, find a VS 15 instance ourselves.
    cmVSSetupAPIHelper vsSetupAPIHelper(15);
    if (vsSetupAPIHelper.GetVSInstanceInfo(value)) {
      cmSystemTools::ConvertToUnixSlashes(value);
    }
  } else if (key == "VS_16_DIR") {
    // If generating for the VS 16 IDE, use the same instance.
    cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
    if (cmHasLiteralPrefix(gg->GetName(), "Visual Studio 16 ")) {
      cmGlobalVisualStudioVersionedGenerator* vs16gen =
        static_cast<cmGlobalVisualStudioVersionedGenerator*>(gg);
      if (vs16gen->GetVSInstance(value)) {
        return true;
      }
    }

    // Otherwise, find a VS 16 instance ourselves.
    cmVSSetupAPIHelper vsSetupAPIHelper(16);
    if (vsSetupAPIHelper.GetVSInstanceInfo(value)) {
      cmSystemTools::ConvertToUnixSlashes(value);
    }
#endif
  } else {
    std::string e = "does not recognize <key> " + key;
    this->SetError(e);
    return false;
  }

  return true;
}